

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void PPrintPhp(TidyDocImpl *doc,uint indent,Node *node)

{
  ulong uVar1;
  Bool wrapPhp;
  TidyPrintImpl *pprint;
  Node *node_local;
  uint indent_local;
  TidyDocImpl *doc_local;
  
  uVar1 = (doc->config).value[0x5e].v;
  AddString(&doc->pprint,"<?");
  PPrintText(doc,0x10,indent,node);
  AddString(&doc->pprint,"?>");
  if ((int)uVar1 != 0) {
    PCondFlushLine(doc,indent);
  }
  return;
}

Assistant:

static void PPrintPhp( TidyDocImpl* doc, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool wrapPhp = cfgBool( doc, TidyWrapPhp );
    /* uint saveWrap = WrapOffCond( doc, !wrapPhp  ); */

    AddString( pprint, "<?" );
    PPrintText( doc, CDATA, indent, node );
    AddString( pprint, "?>" );

    /* Issue #437 - add a new line if 'wrap-php' is on */
    if (wrapPhp)
        PCondFlushLine( doc, indent ); 
       
    /* WrapOn( doc, saveWrap ); */
}